

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O0

stbir_uint8 stbir__linear_to_srgb_uchar(float in)

{
  stbir__FP32 f;
  stbir_uint32 t;
  stbir_uint32 scale;
  stbir_uint32 bias;
  stbir_uint32 tab;
  float in_local;
  
  bias = (stbir_uint32)in;
  if (in <= 0.00012207031) {
    bias = 0x39000000;
  }
  if (0.99999994 < (float)bias) {
    bias = 0x3f7fffff;
  }
  return (stbir_uint8)
         ((fp32_to_srgb8_tab4[bias + 0xc7000000 >> 0x14] >> 0x10) * 0x200 +
          (fp32_to_srgb8_tab4[bias + 0xc7000000 >> 0x14] & 0xffff) * (bias >> 0xc & 0xff) >> 0x10);
}

Assistant:

static stbir_uint8 stbir__linear_to_srgb_uchar(float in)
{
    static const stbir__FP32 almostone = { 0x3f7fffff }; // 1-eps
    static const stbir__FP32 minval = { (127-13) << 23 };
    stbir_uint32 tab,bias,scale,t;
    stbir__FP32 f;

    // Clamp to [2^(-13), 1-eps]; these two values map to 0 and 1, respectively.
    // The tests are carefully written so that NaNs map to 0, same as in the reference
    // implementation.
    if (!(in > minval.f)) // written this way to catch NaNs
        in = minval.f;
    if (in > almostone.f)
        in = almostone.f;

    // Do the table lookup and unpack bias, scale
    f.f = in;
    tab = fp32_to_srgb8_tab4[(f.u - minval.u) >> 20];
    bias = (tab >> 16) << 9;
    scale = tab & 0xffff;

    // Grab next-highest mantissa bits and perform linear interpolation
    t = (f.u >> 12) & 0xff;
    return (unsigned char) ((bias + scale*t) >> 16);
}